

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ExpressionBinder::QualifyColumnNameWithManyDots
          (ExpressionBinder *this,ColumnRefExpression *col_ref,ErrorData *error)

{
  undefined1 auVar1 [8];
  element_type *peVar2;
  idx_t *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *base;
  undefined8 __n;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  result_expr;
  idx_t struct_extract_start;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  element_type *local_40;
  undefined8 local_38;
  
  local_38 = (long)(*(long *)((long)&(error->final_message).field_2 + 8) -
                   (error->final_message).field_2._M_allocated_capacity) >> 5;
  QualifyColumnNameWithManyDotsInternal((ExpressionBinder *)local_50,col_ref,error,in_RCX);
  if (local_50 == (undefined1  [8])0x0) {
    this->_vptr_ExpressionBinder = (_func_int **)0x0;
  }
  else {
    if ((ulong)local_38 <
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        ((long)(*(long *)((long)&(error->final_message).field_2 + 8) -
               (error->final_message).field_2._M_allocated_capacity) >> 5)) {
      __n = local_38;
      do {
        local_48._M_p = (pointer)local_50;
        local_50 = (undefined1  [8])0x0;
        base = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__n;
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&(error->final_message).field_2,__n);
        CreateStructExtract((ExpressionBinder *)&stack0xffffffffffffffc0,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)base,(string *)&local_48);
        peVar2 = local_40;
        auVar1 = local_50;
        local_40 = (element_type *)0x0;
        local_50 = (undefined1  [8])peVar2;
        if (auVar1 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)auVar1 + 8))();
        }
        local_40 = (element_type *)0x0;
        if ((element_type *)local_48._M_p != (element_type *)0x0) {
          (**(code **)(*(_func_int **)local_48._M_p + 8))();
        }
        local_48._M_p = (pointer)0x0;
        __n = (long)&(((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__n)->
                           _vptr__Sp_counted_base)->_M_t).
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 1;
      } while ((ulong)__n <
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(*(long *)((long)&(error->final_message).field_2 + 8) -
                      (error->final_message).field_2._M_allocated_capacity) >> 5));
    }
    this->_vptr_ExpressionBinder = (_func_int **)local_50;
    local_50 = (undefined1  [8])0x0;
  }
  if (local_50 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_50)[1])();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ExpressionBinder::QualifyColumnNameWithManyDots(ColumnRefExpression &col_ref,
                                                                             ErrorData &error) {
	idx_t struct_extract_start = col_ref.column_names.size();
	auto result_expr = QualifyColumnNameWithManyDotsInternal(col_ref, error, struct_extract_start);
	if (!result_expr) {
		return nullptr;
	}

	// create a struct extract with all remaining column names
	for (idx_t i = struct_extract_start; i < col_ref.column_names.size(); i++) {
		result_expr = CreateStructExtract(std::move(result_expr), col_ref.column_names[i]);
	}

	return result_expr;
}